

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O1

ChMatrix33<double> * __thiscall
chrono::fea::ChElementShellANCF_3443::GetPK2Stress
          (ChMatrix33<double> *__return_storage_ptr__,ChElementShellANCF_3443 *this,double layer,
          double xi,double eta,double layer_zeta)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  pointer pLVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ChKblockGeneric *pCVar26;
  double *pdVar27;
  Index row;
  long lVar28;
  ChElementShellANCF_3443 *this_00;
  ChElementShellANCF_3443 *this_01;
  ActualDstType actualDst;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  double dVar39;
  undefined1 auVar40 [16];
  double dVar42;
  undefined1 auVar41 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  ChVectorN<double,_6> sigmaPK2;
  ChMatrixNMc<double,_3,_3> F;
  ChMatrixNM<double,_6,_6> D;
  ChMatrix33<double> J_0xi;
  Matrix3xN e_bar;
  MatrixNx3c Sxi_D;
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  double local_6e0;
  double dStack_6d8;
  Scalar local_688;
  Matrix<double,_3,_3,_0,_3,_3> local_680;
  Matrix<double,_3,_3,_0,_3,_3> local_600;
  undefined1 local_580 [392];
  double dStack_3f8;
  double dStack_3f0;
  double dStack_3e8;
  double dStack_3e0;
  double dStack_3d8;
  double dStack_3d0;
  double dStack_3c8;
  double local_3c0;
  undefined1 local_380 [16];
  double local_370;
  double local_368;
  double local_360;
  double local_358;
  double local_350;
  double local_348;
  double local_340;
  double local_338;
  MatrixNx3c *local_330;
  Matrix<double,_3,_3,_1,_3,_3> *local_328;
  double local_320;
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  auVar38._8_56_ = in_register_00001208;
  auVar38._0_8_ = layer;
  lVar28 = vcvttsd2usi_avx512f(auVar38._0_16_);
  dVar39 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar28].m_thickness;
  Calc_Sxi_D(this,(MatrixNx3c *)local_200,xi,eta,layer_zeta,dVar39,
             ((this->m_layer_zoffsets).super__Vector_base<double,_Eigen::aligned_allocator<double>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar28] - this->m_thicknessZ * 0.5) +
             dVar39 * 0.5 + this->m_midsurfoffset);
  local_3c0 = 0.0;
  local_580._384_8_ = 0.0;
  dStack_3f8 = 0.0;
  dStack_3f0 = 0.0;
  dStack_3e8 = 0.0;
  dStack_3e0 = 0.0;
  dStack_3d8 = 0.0;
  dStack_3d0 = 0.0;
  dStack_3c8 = 0.0;
  local_380._0_8_ = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,3,0,16,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,3,3,1,3,3>>
            ((Matrix<double,_3,_3,_1,_3,_3> *)(local_580 + 0x180),&this->m_ebar0,
             (MatrixNx3c *)local_200,(Scalar *)local_380);
  local_580._0_8_ = (MatrixNx3c *)local_200;
  local_580._8_8_ = (Matrix<double,_3,_3,_1,_3,_3> *)(local_580 + 0x180);
  local_380._0_8_ = (MatrixNx3c *)local_200;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_3,_3,_1,_3,_3> *)(local_380 + 8),(SrcXprType *)(local_580 + 8),
        (assign_op<double,_double> *)&local_600);
  local_330 = (MatrixNx3c *)local_380._0_8_;
  local_320 = 1.48219693752374e-323;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_380._8_8_;
  auVar33 = vbroadcastsd_avx512f(auVar29);
  auVar38 = *(undefined1 (*) [64])
             (((PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_> *)local_380._0_8_)->
             m_storage).m_data.array;
  auVar34 = vmulpd_avx512f(auVar38,auVar33);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_360;
  auVar35 = vbroadcastsd_avx512f(auVar30);
  auVar1 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_> *)local_380._0_8_)->
             m_storage).m_data.array + 8);
  auVar2 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_> *)local_380._0_8_)->
             m_storage).m_data.array + 0x10);
  auVar3 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_> *)local_380._0_8_)->
             m_storage).m_data.array + 0x18);
  auVar4 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_> *)local_380._0_8_)->
             m_storage).m_data.array + 0x20);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = local_348;
  auVar36 = vbroadcastsd_avx512f(auVar31);
  auVar34 = vfmadd231pd_avx512f(auVar34,auVar2,auVar35);
  local_200 = vfmadd231pd_avx512f(auVar34,auVar4,auVar36);
  auVar33 = vmulpd_avx512f(auVar33,auVar1);
  auVar34 = vfmadd231pd_avx512f(auVar33,auVar3,auVar35);
  auVar33 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_> *)local_380._0_8_)->
              m_storage).m_data.array + 0x28);
  local_1c0 = vfmadd231pd_avx512f(auVar34,auVar33,auVar36);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_370;
  auVar34 = vbroadcastsd_avx512f(auVar32);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_358;
  auVar35 = vbroadcastsd_avx512f(auVar5);
  auVar36 = vmulpd_avx512f(auVar38,auVar34);
  auVar36 = vfmadd231pd_avx512f(auVar36,auVar2,auVar35);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_340;
  auVar37 = vbroadcastsd_avx512f(auVar6);
  local_180 = vfmadd231pd_avx512f(auVar36,auVar4,auVar37);
  auVar34 = vmulpd_avx512f(auVar1,auVar34);
  auVar34 = vfmadd231pd_avx512f(auVar34,auVar3,auVar35);
  local_140 = vfmadd231pd_avx512f(auVar34,auVar33,auVar37);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_368;
  auVar34 = vbroadcastsd_avx512f(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_350;
  auVar35 = vbroadcastsd_avx512f(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_338;
  auVar36 = vbroadcastsd_avx512f(auVar9);
  auVar38 = vmulpd_avx512f(auVar38,auVar34);
  auVar38 = vfmadd231pd_avx512f(auVar38,auVar35,auVar2);
  local_100 = vfmadd231pd_avx512f(auVar38,auVar36,auVar4);
  auVar38 = vmulpd_avx512f(auVar1,auVar34);
  auVar38 = vfmadd231pd_avx512f(auVar38,auVar3,auVar35);
  local_c0 = vfmadd231pd_avx512f(auVar38,auVar33,auVar36);
  local_328 = (Matrix<double,_3,_3,_1,_3,_3> *)(local_380 + 8);
  CalcCoordMatrix(this,(Matrix3xN *)local_380);
  local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  local_580._0_8_ = (_func_int **)0x3ff0000000000000;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,3,0,16,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,3,3,0,3,3>>
            (&local_600,(Matrix3xN *)local_380,(MatrixNx3c *)local_200,(Scalar *)local_580);
  dVar19 = (local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2] *
            local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2] +
            local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] *
            local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] +
            local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1] *
            local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1] + -1.0) * 0.5;
  dVar20 = (local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5] *
            local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5] +
            local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[3] *
            local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[3] +
            local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4] *
            local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4] + -1.0) * 0.5;
  dVar21 = (local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[8] *
            local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[8] +
            local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] *
            local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] +
            local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[7] *
            local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[7] + -1.0) * 0.5;
  dVar39 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] *
           local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8] +
           local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] *
           local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6] +
           local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4] *
           local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
  dVar42 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2] *
           local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8] +
           local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0] *
           local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6] +
           local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1] *
           local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
  dVar18 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2] *
           local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] +
           local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0] *
           local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] +
           local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1] *
           local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar18;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar42;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar39;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar21;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar20;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar19;
  if (this->m_damping_enabled == true) {
    CalcCoordDerivMatrix(this,(Matrix3xN *)local_580);
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = 0.0;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
         = 0.0;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = 0.0;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
         = 0.0;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
         = 0.0;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
         = 0.0;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6]
         = 0.0;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
         = 0.0;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
         = 0.0;
    local_688 = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,3,0,16,3>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,3,3,0,3,3>>
              (&local_680,(Matrix3xN *)local_580,(Matrix<double,_16,_3,_0,_16,_3> *)local_200,
               &local_688);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = this->m_Alpha;
    auVar23._8_8_ =
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar23._0_8_ =
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar22._8_8_ =
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar22._0_8_ =
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar29 = vmulpd_avx512vl(auVar23,auVar22);
    auVar50._8_8_ = 0;
    auVar50._0_8_ =
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar60._8_8_ = 0;
    auVar60._0_8_ =
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar30 = vmulsd_avx512f(auVar50,auVar60);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar19;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = auVar29._0_8_ + auVar29._8_8_ + auVar30._0_8_;
    auVar29 = vfmadd213sd_fma(auVar49,auVar40,auVar10);
    auVar24._8_8_ =
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar24._0_8_ =
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar54._8_8_ = 0;
    auVar54._0_8_ =
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar20;
    auVar53._8_8_ = 0;
    auVar53._0_8_ =
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] *
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] *
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar30 = vfmadd213sd_fma(auVar53,auVar40,auVar11);
    auVar25._8_8_ =
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar25._0_8_ =
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar57._0_8_ =
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar57._8_8_ =
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar58._8_8_ = 0;
    auVar58._0_8_ =
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar59._8_8_ = 0;
    auVar59._0_8_ =
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar31 = vmulsd_avx512f(auVar58,auVar59);
    auVar31 = vaddsd_avx512f(auVar57,auVar31);
    auVar45._0_8_ =
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar45._8_8_ =
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar32 = vmulsd_avx512f(auVar54,auVar59);
    auVar32 = vaddsd_avx512f(auVar45,auVar32);
    local_6f0 = vunpcklpd_avx(auVar29,auVar30);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar21;
    auVar29 = vfmadd213sd_fma(auVar31,auVar40,auVar12);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar39;
    auVar46._8_8_ = 0;
    auVar46._0_8_ =
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] + auVar32._0_8_;
    auVar30 = vfmadd213sd_fma(auVar46,auVar40,auVar13);
    local_700 = vunpcklpd_avx(auVar29,auVar30);
    auVar29 = vmulpd_avx512vl(auVar22,auVar25);
    auVar30 = vmulsd_avx512f(auVar60,auVar58);
    auVar31 = vmulpd_avx512vl(auVar22,auVar24);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar42;
    auVar47._8_8_ = 0;
    auVar47._0_8_ =
         auVar29._0_8_ + auVar29._8_8_ + auVar30._0_8_ +
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] +
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] +
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] *
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar29 = vfmadd213sd_fma(auVar47,auVar40,auVar14);
    auVar61._8_8_ = 0;
    auVar61._0_8_ =
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar30 = vmulsd_avx512f(auVar61,auVar54);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar18;
    auVar44._8_8_ = 0;
    auVar44._0_8_ =
         auVar31._0_8_ + auVar31._8_8_ + auVar30._0_8_ +
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] *
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] *
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar30 = vfmadd213sd_fma(auVar44,auVar40,auVar15);
    auVar29 = vunpcklpd_avx(auVar29,auVar30);
  }
  else {
    local_6f0 = vunpcklpd_avx(auVar56,auVar55);
    local_700 = vunpcklpd_avx(auVar52,auVar51);
    auVar29 = vunpcklpd_avx(auVar48,auVar43);
  }
  pLVar16 = (this->m_layers).
            super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar17 = (long)pLVar16[lVar28].m_material.
                 super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
  this_01 = (ChElementShellANCF_3443 *)
            pLVar16[lVar28].m_material.
            super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 == (ChElementShellANCF_3443 *)0x0) {
    this_00 = (ChElementShellANCF_3443 *)local_580;
    memcpy(this_00,(void *)(lVar17 + 0x20),0x120);
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pCVar26 = (ChKblockGeneric *)
                ((long)&(this_01->super_ChElementShell).super_ChElementGeneric + 8);
      *(int *)&(pCVar26->super_ChKblock)._vptr_ChKblock =
           *(int *)&(pCVar26->super_ChKblock)._vptr_ChKblock + 1;
      UNLOCK();
    }
    else {
      pCVar26 = (ChKblockGeneric *)
                ((long)&(this_01->super_ChElementShell).super_ChElementGeneric + 8);
      *(int *)&(pCVar26->super_ChKblock)._vptr_ChKblock =
           *(int *)&(pCVar26->super_ChKblock)._vptr_ChKblock + 1;
    }
    this_00 = (ChElementShellANCF_3443 *)local_580;
    memcpy(this_00,(void *)(lVar17 + 0x20),0x120);
    if (this_01 != (ChElementShellANCF_3443 *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
      this_00 = this_01;
    }
  }
  RotateReorderStiffnessMatrix
            (this_00,(ChMatrixNM<double,_6,_6> *)local_580,
             (this->m_layers).
             super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar28].m_theta);
  pdVar27 = (double *)(local_580 + 0x20);
  lVar28 = 0;
  local_6e0 = auVar29._0_8_;
  dStack_6d8 = auVar29._8_8_;
  do {
    dVar39 = (double)local_6f0._0_8_ * pdVar27[-4] +
             (double)local_700._0_8_ * pdVar27[-2] + local_6e0 * *pdVar27;
    dVar42 = (double)local_6f0._8_8_ * pdVar27[-3] +
             (double)local_700._8_8_ * pdVar27[-1] + dStack_6d8 * pdVar27[1];
    auVar41._0_8_ = dVar39 + dVar42;
    auVar41._8_8_ = dVar39 + dVar42;
    dVar39 = (double)vmovlpd_avx(auVar41);
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [lVar28] = dVar39;
    lVar28 = lVar28 + 1;
    pdVar27 = pdVar27 + 6;
  } while (lVar28 != 6);
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  return __return_storage_ptr__;
}

Assistant:

ChMatrix33<> ChElementShellANCF_3443::GetPK2Stress(const double layer,
                                                   const double xi,
                                                   const double eta,
                                                   const double layer_zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    double layer_midsurface_offset =
        -m_thicknessZ / 2 + m_layer_zoffsets[layer] + m_layers[layer].Get_thickness() / 2 + m_midsurfoffset;
    Calc_Sxi_D(Sxi_D, xi, eta, layer_zeta, m_layers[layer].Get_thickness(), layer_midsurface_offset);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    // Calculate the Green-Lagrange strain tensor at the current point in Voigt notation
    ChVectorN<double, 6> epsilon_combined;
    epsilon_combined(0) = 0.5 * (F.col(0).dot(F.col(0)) - 1);
    epsilon_combined(1) = 0.5 * (F.col(1).dot(F.col(1)) - 1);
    epsilon_combined(2) = 0.5 * (F.col(2).dot(F.col(2)) - 1);
    epsilon_combined(3) = F.col(1).dot(F.col(2));
    epsilon_combined(4) = F.col(0).dot(F.col(2));
    epsilon_combined(5) = F.col(0).dot(F.col(1));

    if (m_damping_enabled) {
        Matrix3xN ebardot;  // Element coordinate time derivatives in matrix form
        CalcCoordDerivMatrix(ebardot);

        // Calculate the time derivative of the Deformation Gradient at the current point
        ChMatrixNMc<double, 3, 3> Fdot = ebardot * Sxi_D;

        // Calculate the time derivative of the Green-Lagrange strain tensor in Voigt notation
        // and combine it with epsilon assuming a Linear Kelvin-Voigt Viscoelastic material model
        epsilon_combined(0) += m_Alpha * F.col(0).dot(Fdot.col(0));
        epsilon_combined(1) += m_Alpha * F.col(1).dot(Fdot.col(1));
        epsilon_combined(2) += m_Alpha * F.col(2).dot(Fdot.col(2));
        epsilon_combined(3) += m_Alpha * (F.col(1).dot(Fdot.col(2)) + Fdot.col(1).dot(F.col(2)));
        epsilon_combined(4) += m_Alpha * (F.col(0).dot(Fdot.col(2)) + Fdot.col(0).dot(F.col(2)));
        epsilon_combined(5) += m_Alpha * (F.col(0).dot(Fdot.col(1)) + Fdot.col(0).dot(F.col(1)));
    }

    // Get the stiffness tensor in 6x6 matrix form for the current layer and rotate it in the midsurface according
    // to the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in
    // this element compared to what is used in ChMaterialShellANCF

    ChMatrixNM<double, 6, 6> D = m_layers[layer].GetMaterial()->Get_E_eps();
    RotateReorderStiffnessMatrix(D, m_layers[layer].Get_theta());

    ChVectorN<double, 6> sigmaPK2 = D * epsilon_combined;  // 2nd Piola Kirchhoff Stress tensor in Voigt notation

    ChMatrix33<> SPK2;
    SPK2(0, 0) = sigmaPK2(0);
    SPK2(1, 1) = sigmaPK2(1);
    SPK2(2, 2) = sigmaPK2(2);
    SPK2(1, 2) = sigmaPK2(3);
    SPK2(2, 1) = sigmaPK2(3);
    SPK2(0, 2) = sigmaPK2(4);
    SPK2(2, 0) = sigmaPK2(4);
    SPK2(0, 1) = sigmaPK2(5);
    SPK2(1, 0) = sigmaPK2(5);

    return SPK2;
}